

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll-test.c
# Opt level: O3

void * connector_client(void *arg)

{
  uint __fd;
  int iVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  undefined8 uVar5;
  epoll_event event;
  epoll_event local_30;
  
  __fd = socket(2,0x80001,0);
  iVar3 = connector_epfd;
  if ((int)__fd < 0) {
    pcVar4 = "sock >= 0";
    uVar5 = 0x42;
  }
  else {
    if (-1 < connector_epfd) {
      local_30.events = 5;
      local_30._4_4_ = __fd;
      iVar1 = epoll_ctl(connector_epfd,1,__fd,&local_30);
      if (iVar1 != 0) {
        pcVar4 = "epoll_ctl(ep, EPOLL_CTL_ADD, sock, &event) == 0";
        uVar5 = 0x4b;
        goto LAB_001048a9;
      }
      iVar1 = 3;
      do {
        iVar2 = epoll_wait(iVar3,&local_30,1,300);
        if (iVar2 != 0) {
          if (iVar2 != 1) {
            pcVar4 = "ret == 1";
            uVar5 = 0x56;
            goto LAB_001048a9;
          }
          if (local_30.events != 0x14) {
            pcVar4 = "event.events == (EPOLLOUT | EPOLLHUP)";
            uVar5 = 0x57;
            goto LAB_001048a9;
          }
        }
        iVar1 = iVar1 + -1;
      } while (iVar1 != 0);
    }
    local_30.data.u64._4_4_ = 0;
    local_30._4_8_ = 0;
    local_30.events = 0x39050002;
    iVar3 = inet_pton(2,"127.0.0.1",&local_30.field_0x4);
    if (iVar3 == 1) {
      iVar3 = connect(__fd,(sockaddr *)&local_30,0x10);
      if (iVar3 == 0) {
        return (void *)(ulong)__fd;
      }
      pcVar4 = "connect(sock, (struct sockaddr const *)&addr, sizeof(addr)) == 0";
      uVar5 = 0x61;
    }
    else {
      pcVar4 = "inet_pton(AF_INET, \"127.0.0.1\", &addr.sin_addr) == 1";
      uVar5 = 0x5e;
    }
  }
LAB_001048a9:
  microatf_fail_require
            ("%s:%d: %s not met",
             "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
             ,uVar5,pcVar4);
}

Assistant:

static void *
connector_client(void *arg)
{
	(void)arg;

	int sock = socket(PF_INET, SOCK_STREAM | SOCK_CLOEXEC, 0);
	ATF_REQUIRE(sock >= 0);

	if (connector_epfd >= 0) {
		int ep = connector_epfd;

		struct epoll_event event;
		event.events = EPOLLOUT | EPOLLIN;
		event.data.fd = sock;

		ATF_REQUIRE(epoll_ctl(ep, EPOLL_CTL_ADD, sock, &event) == 0);

		int ret;

		for (int i = 0; i < 3; ++i) {
			ret = epoll_wait(ep, &event, 1, 300);
#ifndef EV_FORCEONESHOT
			if (ret == 0) {
				continue;
			}
#endif
			ATF_REQUIRE(ret == 1);
			ATF_REQUIRE(event.events == (EPOLLOUT | EPOLLHUP));
		}
	}

	struct sockaddr_in addr = { 0 };
	addr.sin_family = AF_INET;
	addr.sin_port = htons(1337);
	ATF_REQUIRE(inet_pton(AF_INET, "127.0.0.1", &addr.sin_addr) == 1);

	ATF_REQUIRE(
	    connect(sock, (struct sockaddr const *)&addr, sizeof(addr)) == 0);

	return (void *)(intptr_t)sock;
}